

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_aux.c
# Opt level: O3

int TIFFDefaultTransferFunction(TIFF *tif,TIFFDirectory *td)

{
  uint16_t **ppuVar1;
  ushort uVar2;
  double dVar3;
  uint16_t *puVar4;
  int iVar5;
  long s;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  td->td_transferfunction[0] = (uint16_t *)0x0;
  td->td_transferfunction[1] = (uint16_t *)0x0;
  td->td_transferfunction[2] = (uint16_t *)0x0;
  uVar2 = td->td_bitspersample;
  iVar5 = 0;
  if (0x3d < uVar2) {
    return 0;
  }
  ppuVar1 = td->td_transferfunction;
  uVar7 = 1L << ((byte)uVar2 & 0x3f);
  s = 2L << ((byte)uVar2 & 0x3f);
  puVar4 = (uint16_t *)_TIFFmallocExt(tif,s);
  *ppuVar1 = puVar4;
  if (puVar4 == (uint16_t *)0x0) {
    return 0;
  }
  *puVar4 = 0;
  if (uVar2 != 0) {
    uVar6 = 2;
    if (2 < uVar7) {
      uVar6 = uVar7;
    }
    uVar8 = 1;
    do {
      dVar3 = pow((double)(long)uVar8 / ((double)(long)uVar7 + -1.0),2.2);
      dVar3 = floor(dVar3 * 65535.0 + 0.5);
      (*ppuVar1)[uVar8] = (uint16_t)(int)dVar3;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if ((int)((uint)td->td_samplesperpixel - (uint)td->td_extrasamples) < 2) {
LAB_0028977b:
    iVar5 = 1;
  }
  else {
    puVar4 = (uint16_t *)_TIFFmallocExt(tif,s);
    td->td_transferfunction[1] = puVar4;
    if (puVar4 != (uint16_t *)0x0) {
      _TIFFmemcpy(puVar4,td->td_transferfunction[0],s);
      puVar4 = (uint16_t *)_TIFFmallocExt(tif,s);
      td->td_transferfunction[2] = puVar4;
      if (puVar4 != (uint16_t *)0x0) {
        _TIFFmemcpy(puVar4,*ppuVar1,s);
        goto LAB_0028977b;
      }
    }
    if (*ppuVar1 != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,*ppuVar1);
    }
    if (td->td_transferfunction[1] != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,td->td_transferfunction[1]);
    }
    if (td->td_transferfunction[2] != (uint16_t *)0x0) {
      _TIFFfreeExt(tif,td->td_transferfunction[2]);
    }
    *ppuVar1 = (uint16_t *)0x0;
    td->td_transferfunction[1] = (uint16_t *)0x0;
    td->td_transferfunction[2] = (uint16_t *)0x0;
  }
  return iVar5;
}

Assistant:

static int TIFFDefaultTransferFunction(TIFF *tif, TIFFDirectory *td)
{
    uint16_t **tf = td->td_transferfunction;
    tmsize_t i, n, nbytes;

    tf[0] = tf[1] = tf[2] = 0;
    if (td->td_bitspersample >= sizeof(tmsize_t) * 8 - 2)
        return 0;

    n = ((tmsize_t)1) << td->td_bitspersample;
    nbytes = n * sizeof(uint16_t);
    tf[0] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
    if (tf[0] == NULL)
        return 0;
    tf[0][0] = 0;
    for (i = 1; i < n; i++)
    {
        double t = (double)i / ((double)n - 1.);
        tf[0][i] = (uint16_t)floor(65535. * pow(t, 2.2) + .5);
    }

    if (td->td_samplesperpixel - td->td_extrasamples > 1)
    {
        tf[1] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
        if (tf[1] == NULL)
            goto bad;
        _TIFFmemcpy(tf[1], tf[0], nbytes);
        tf[2] = (uint16_t *)_TIFFmallocExt(tif, nbytes);
        if (tf[2] == NULL)
            goto bad;
        _TIFFmemcpy(tf[2], tf[0], nbytes);
    }
    return 1;

bad:
    if (tf[0])
        _TIFFfreeExt(tif, tf[0]);
    if (tf[1])
        _TIFFfreeExt(tif, tf[1]);
    if (tf[2])
        _TIFFfreeExt(tif, tf[2]);
    tf[0] = tf[1] = tf[2] = 0;
    return 0;
}